

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
          (anon_unknown_0 *this,
          CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep,
          RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage)

{
  anon_unknown_0 aVar1;
  int iVar2;
  long lVar3;
  sbyte sVar4;
  anon_unknown_0 *paVar5;
  Nonnull<const_CordRep_*> pCVar6;
  sbyte sVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar9 = rep.fraction;
  pCVar6 = rep.rep;
  if (this == (anon_unknown_0 *)0x0) {
    __assert_fail("edge != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                  ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
  }
  aVar1 = this[0xc];
  if ((byte)aVar1 < 5) {
    paVar5 = this;
    if (aVar1 == (anon_unknown_0)0x1) {
      paVar5 = *(anon_unknown_0 **)(this + 0x18);
    }
    if ((byte)paVar5[0xc] < 5) {
      __assert_fail("IsDataEdge(rep.rep)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0x78,
                    "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                   );
    }
  }
  if (aVar1 == (anon_unknown_0)0x1) {
    pCVar6->length = (size_t)(dVar9 * 32.0 + (double)pCVar6->length);
    this = *(anon_unknown_0 **)(this + 0x18);
    iVar2 = *(int *)(this + 8) >> 1;
    auVar10._8_4_ = *(int *)(this + 8) >> 0x1f;
    auVar10._0_8_ = (long)iVar2;
    auVar10._12_4_ = 0x45300000;
    dVar9 = dVar9 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0));
  }
  aVar1 = this[0xc];
  if ((byte)aVar1 < 6) {
    lVar3 = *(long *)this + 0x28;
  }
  else {
    if (((byte)aVar1 - 0xf9 < 7) || ((byte)aVar1 < 6)) {
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    iVar2 = -0xb8000;
    if ((byte)aVar1 < 0xbb) {
      iVar2 = -0xe80;
    }
    sVar7 = 0xc;
    if ((byte)aVar1 < 0xbb) {
      sVar7 = 6;
    }
    iVar8 = -0x10;
    if (0x42 < (byte)aVar1) {
      iVar8 = iVar2;
    }
    sVar4 = 3;
    if (0x42 < (byte)aVar1) {
      sVar4 = sVar7;
    }
    lVar3 = (long)(int)(((uint)(byte)aVar1 << sVar4) + iVar8);
  }
  auVar11._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar11._0_8_ = lVar3;
  auVar11._12_4_ = 0x45300000;
  pCVar6->length =
       (size_t)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * dVar9 +
               (double)pCVar6->length);
  return;
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}